

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall WriterTest_WriteWideChar_Test::TestBody(WriterTest_WriteWideChar_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertionResult *pAVar3;
  char *message;
  AssertionResult gtest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> expected;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> actual;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> os;
  AssertionResult local_a08;
  char *local_9f8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_9f0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_9d0;
  wchar_t local_9b0;
  undefined4 uStack_9ac;
  undefined1 local_9a0 [16];
  AssertionResult local_990 [7];
  ios_base local_920 [264];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_818;
  undefined4 *local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined4 local_7f8;
  undefined1 auStack_7f4 [1996];
  
  uStack_808 = 1;
  local_800 = 500;
  local_818.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8d18
  ;
  local_9f8 = "char";
  local_7f8 = 0x61;
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  local_810 = &local_7f8;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_9d0,&local_7f8,auStack_7f4);
  local_9f0._M_string_length = 0;
  local_9f0.field_2._M_local_buf[0] = L'\0';
  local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_990);
  local_9b0 = L'a';
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)local_990,&local_9b0,1);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wstring::operator=((wstring *)&local_9f0,(wstring *)&local_9b0);
  if ((undefined1 *)CONCAT44(uStack_9ac,local_9b0) != local_9a0) {
    operator_delete((undefined1 *)CONCAT44(uStack_9ac,local_9b0));
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_990);
  std::ios_base::~ios_base(local_920);
  if ((local_9f0._M_string_length == local_9d0._M_string_length) &&
     ((local_9f0._M_string_length == 0 ||
      (iVar2 = wmemcmp(local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,
                       local_9f0._M_string_length), iVar2 == 0)))) {
    testing::AssertionSuccess();
  }
  else {
    testing::AssertionFailure();
    pAVar3 = testing::AssertionResult::operator<<(local_990,(char (*) [19])"Value of: (Writer<");
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_9f8);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [21])">() << value).str()\n");
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x250069);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_9d0);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [2])0x250738);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x250075);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_9f0);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [2])0x250738);
    testing::AssertionResult::AssertionResult(&local_a08,pAVar3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_990[0].message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p);
  }
  local_818.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8d18
  ;
  if (local_810 != &local_7f8) {
    operator_delete(local_810);
  }
  if (local_a08.success_ == false) {
    testing::Message::Message((Message *)&local_818);
    if (local_a08.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_a08.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x2ae,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_990,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_990);
    if (local_818.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_818.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_818.ptr_ + 8))();
      }
      local_818.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a08.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(WriterTest, WriteWideChar) {
  CHECK_WRITE_WCHAR(L'a');
}